

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<QPersistentModelIndexData_*>_>::relocate
          (QArrayDataPointer<QList<QPersistentModelIndexData_*>_> *this,qsizetype offset,
          QList<QPersistentModelIndexData_*> **data)

{
  bool bVar1;
  QList<QPersistentModelIndexData_*> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QList<QPersistentModelIndexData_*> *res;
  
  first = (QList<QPersistentModelIndexData_*> *)(*(long *)(in_RDI + 8) + in_RSI * 0x18);
  QtPrivate::q_relocate_overlap_n<QList<QPersistentModelIndexData*>,long_long>
            (first,in_RDI,(QList<QPersistentModelIndexData_*> *)0x81d4d4);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QList<QPersistentModelIndexData*>>,QList<QPersistentModelIndexData*>const*>
                        (data,(QArrayDataPointer<QList<QPersistentModelIndexData_*>_> *)res), bVar1)
     ) {
    *in_RDX = in_RSI * 0x18 + *in_RDX;
  }
  *(QList<QPersistentModelIndexData_*> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }